

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O3

void net_tests::cnetaddr_serialize_v1_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  ios_base *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  cnetaddr_serialize_v1 t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 local_670 [112];
  ios_base local_600 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d8 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_678 = "";
  memset((ostringstream *)local_4d8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
  local_360[0]._M_string_length = 0;
  local_360[0].field_2._M_local_buf[0] = '\0';
  local_670[0] = (ostringstream)0x22;
  local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,local_670,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4d8,"cnetaddr_serialize_v1",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_360,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670);
  if ((undefined1 *)CONCAT71(local_670._1_7_,local_670[0]) != local_670 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_670._1_7_,local_670[0]),local_670._16_8_ + 1);
  }
  local_690 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360[0]._M_dataplus._M_p;
  local_688 = local_360[0]._M_dataplus._M_p + local_360[0]._M_string_length;
  file.m_end = (iterator)0x149;
  file.m_begin = (iterator)&local_680;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_690,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
    operator_delete(local_360[0]._M_dataplus._M_p,
                    CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                             local_360[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
  std::ios_base::~ios_base((ios_base *)(local_4d8 + 0x70));
  RegTestingSetup::RegTestingSetup((RegTestingSetup *)local_4d8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_698 = "";
  memset((ostringstream *)local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  paVar1 = &local_4f8.field_2;
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"cnetaddr_serialize_v1",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_6a8 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_00.m_end = (iterator)0x149;
  file_00.m_begin = (iterator)&local_6a0;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_6b0,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6b8 = "";
  memset((ostringstream *)local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"cnetaddr_serialize_v1",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_6c8 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_01.m_end = (iterator)0x149;
  file_01.m_begin = (iterator)&local_6c0;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_6d0,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  this = local_600;
  std::ios_base::~ios_base(this);
  cnetaddr_serialize_v1::test_method((cnetaddr_serialize_v1 *)this);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6d8 = "";
  memset((ostringstream *)local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"cnetaddr_serialize_v1",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_6e8 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_02.m_end = (iterator)0x149;
  file_02.m_begin = (iterator)&local_6e0;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_6f0,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6f8 = "";
  memset((ostringstream *)local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"cnetaddr_serialize_v1",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_710 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_708 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_03.m_end = (iterator)0x149;
  file_03.m_begin = (iterator)&local_700;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_710,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)local_4d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_serialize_v1)
{
    CNetAddr addr;
    DataStream s{};
    const auto ser_params{CAddress::V1_NETWORK};

    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "00000000000000000000000000000000");
    s.clear();

    addr = LookupHost("1.2.3.4", false).value();
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "00000000000000000000ffff01020304");
    s.clear();

    addr = LookupHost("1a1b:2a2b:3a3b:4a4b:5a5b:6a6b:7a7b:8a8b", false).value();
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "1a1b2a2b3a3b4a4b5a5b6a6b7a7b8a8b");
    s.clear();

    // TORv2, no longer supported
    BOOST_CHECK(!addr.SetSpecial("6hzph5hv6337r6p2.onion"));

    BOOST_REQUIRE(addr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"));
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "00000000000000000000000000000000");
    s.clear();

    addr.SetInternal("a");
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "fd6b88c08724ca978112ca1bbdcafac2");
    s.clear();
}